

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
vera::Camera::setExposure(Camera *this,float _aperture,float _shutterSpeed,float _sensitivity)

{
  double dVar1;
  float e;
  float _sensitivity_local;
  float _shutterSpeed_local;
  float _aperture_local;
  Camera *this_local;
  
  this->m_aperture = _aperture;
  this->m_shutterSpeed = _shutterSpeed;
  this->m_sensitivity = _sensitivity;
  dVar1 = std::log2((double)(ulong)(uint)((((_aperture * _aperture) / _shutterSpeed) * 100.0) /
                                         _sensitivity));
  this->m_ev100 = SUB84(dVar1,0);
  this->m_exposure =
       (double)(1.0 / (((((_aperture * _aperture) / _shutterSpeed) * 100.0) / _sensitivity) * 1.2));
  (this->super_Node).bChange = true;
  return;
}

Assistant:

void  Camera::setExposure(float _aperture, float _shutterSpeed, float _sensitivity) {
    m_aperture = _aperture;
    m_shutterSpeed = _shutterSpeed;
    m_sensitivity = _sensitivity;
    
    // With N = aperture, t = shutter speed and S = sensitivity,
    // we can compute EV100 knowing that:
    //
    // EVs = log2(N^2 / t)
    // and
    // EVs = EV100 + log2(S / 100)
    //
    // We can therefore find:
    //
    // EV100 = EVs - log2(S / 100)
    // EV100 = log2(N^2 / t) - log2(S / 100)
    // EV100 = log2((N^2 / t) * (100 / S))
    //
    // Reference: https://en.wikipedia.org/wiki/Exposure_value
    m_ev100 = std::log2((_aperture * _aperture) / _shutterSpeed * 100.0f / _sensitivity);

    // This is equivalent to calling exposure(ev100(N, t, S))
    // By merging the two calls we can remove extra pow()/log2() calls
    const float e = (_aperture * _aperture) / _shutterSpeed * 100.0f / _sensitivity;
    m_exposure = 1.0f / (1.2f * e);

    bChange = true;
}